

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,uint32 nextOffset)

{
  undefined1 *puVar1;
  byte bVar2;
  StackSym *pSVar3;
  code *pcVar4;
  bool bVar5;
  ValueType valueType;
  RegSlot RVar6;
  uint sourceContextId;
  uint functionId;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  Instr *pIVar9;
  JITTimeFunctionBody *this_00;
  RegOpnd *dstOpnd;
  undefined4 *puVar10;
  GeneratorBailInInstr *label;
  BailOutInfo *pBVar11;
  LabelInstr *instr;
  uint32 uVar12;
  int iVar13;
  undefined6 in_register_00000032;
  StackSym *pSVar14;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  uint32 local_34;
  
  local_34 = offset;
  pRVar7 = BuildSrcOpnd(this,R1,TyVar);
  iVar13 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar13 == 0x182) {
LAB_0049132b:
    pIVar9 = IR::Instr::New(newOpcode,this->m_func);
    pRVar8 = BuildSrcOpnd(this,R0,TyVar);
    IR::Instr::SetSrc1(pIVar9,&pRVar8->super_Opnd);
    IR::Instr::SetSrc2(pIVar9,&pRVar7->super_Opnd);
    uVar12 = local_34;
LAB_004914e2:
    AddInstr(this,pIVar9,uVar12);
    return;
  }
  if (iVar13 == 0xba) {
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar9 = IR::Instr::New(LdFrameDisplay,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
    RVar6 = GetEnvReg(this);
    if (RVar6 != 0xffffffff) {
      pRVar7 = BuildSrcOpnd(this,RVar6,TyVar);
      IR::Instr::SetSrc2(pIVar9,&pRVar7->super_Opnd);
    }
    uVar12 = local_34;
    AddInstr(this,pIVar9,local_34);
    pRVar7 = BuildSrcOpnd(this,R0,TyVar);
    this_00 = Func::GetJITFunctionBody(this->m_func);
    RVar6 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
    dstOpnd = BuildDstOpnd(this,RVar6,TyVar,false,false);
    pIVar9 = IR::Instr::New(LdFrameDisplay,&dstOpnd->super_Opnd,&pRVar7->super_Opnd,
                            &pRVar8->super_Opnd,this->m_func);
    puVar1 = &dstOpnd->m_sym->field_0x18;
    *(uint *)puVar1 = *(uint *)puVar1 | 2;
    goto LAB_004914e2;
  }
  if (iVar13 == 0x108) {
    newOpcode = Typeof;
  }
  else {
    if (iVar13 != 0x10d) {
      if (iVar13 != 0x10e) {
        pSVar3 = pRVar7->m_sym;
        if (iVar13 == 0x46) {
          pRVar8 = BuildDstOpnd(this,R0,TyVar,false,true);
          pSVar14 = pRVar8->m_sym;
        }
        else {
          pRVar8 = BuildDstOpnd(this,R0,TyVar,false,false);
          if (newOpcode == BeginSwitch) {
            SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
            newOpcode = Ld_A;
            goto LAB_0049138d;
          }
          if (newOpcode == Yield) {
            bVar5 = IsLoopBody(this);
            if (bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                                 ,0x75c,"(!this->IsLoopBody())",
                                 "Attempting to JIT loop body containing Yield");
              if (!bVar5) {
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar10 = 0;
            }
            pIVar9 = IR::Instr::New(Yield,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
            AddInstr(this,pIVar9,local_34);
            pIVar9 = IR::Instr::ConvertToBailOutInstr
                               (pIVar9,pIVar9,BailOutForGeneratorYield,0xffffffff);
            this->m_lastInstr = pIVar9;
            label = IR::GeneratorBailInInstr::New(pIVar9,this->m_func);
            puVar1 = &(label->super_LabelInstr).field_0x78;
            *puVar1 = *puVar1 | 4;
            (label->super_LabelInstr).m_name = L"GeneratorBailInLabel";
            AddInstr(this,(Instr *)label,local_34);
            Func::AddYieldOffsetResumeLabel(this->m_func,nextOffset,&label->super_LabelInstr);
            pBVar11 = IR::Instr::GetBailOutInfo(pIVar9);
            uVar12 = local_34;
            pBVar11->bailInInstr = label;
            sourceContextId = Func::GetSourceContextId(this->m_func);
            functionId = Func::GetLocalFunctionId(this->m_func);
            bVar5 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_01453738,BailInPhase,sourceContextId,functionId);
            if (bVar5) {
              instr = IR::LabelInstr::New(GeneratorOutputBailInTraceLabel,this->m_func,false);
              instr->field_0x78 = instr->field_0x78 | 4;
              instr->m_name = L"OutputBailInTrace";
              AddInstr(this,&instr->super_Instr,uVar12);
              pIVar9 = IR::Instr::New(GeneratorOutputBailInTrace,this->m_func);
              AddInstr(this,pIVar9,uVar12);
            }
            pIVar9 = IR::Instr::New(GeneratorResumeYield,&pRVar8->super_Opnd,this->m_func);
            AddInstr(this,pIVar9,uVar12);
            bVar5 = Func::IsJitInDebugMode(this->m_func);
            if (!bVar5) {
              return;
            }
            InsertBailOutForDebugger
                      (this,uVar12,BailOutStep|BailOutBreakPointInFunction|BailOutForceByFlag,
                       (Instr *)0x0);
            return;
          }
          if (newOpcode == Conv_Str) {
            IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)0x800);
            newOpcode = Conv_Str;
            goto LAB_0049138d;
          }
          if (newOpcode == Delete_A) {
            IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)0x400);
            newOpcode = Delete_A;
            goto LAB_0049138d;
          }
          if (newOpcode == LdArrHead) {
            local_36.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::GetObject(Array);
            local_38.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetHasNoMissingValues((ValueType *)&local_36.field_0,false);
            valueType = ValueType::SetArrayTypeId((ValueType *)&local_38.field_0,TypeIds_Array);
            IR::Opnd::SetValueType(&pRVar7->super_Opnd,valueType);
            puVar1 = &(pRVar7->super_Opnd).field_0xb;
            *puVar1 = *puVar1 | 1;
            newOpcode = LdArrHead;
            goto LAB_0049138d;
          }
          pSVar14 = pRVar8->m_sym;
          if (newOpcode == LdInnerFrameDisplayNoParent) {
            pIVar9 = IR::Instr::New(LdInnerFrameDisplay,&pRVar8->super_Opnd,&pRVar7->super_Opnd,
                                    this->m_func);
            uVar12 = local_34;
            AddEnvOpndForInnerFrameDisplay(this,pIVar9,local_34);
            if ((*(uint *)&pSVar14->field_0x18 & 1) != 0) {
              *(uint *)&pSVar14->field_0x18 = *(uint *)&pSVar14->field_0x18 | 2;
            }
            goto LAB_004914e2;
          }
          if (newOpcode != Ld_A) goto LAB_0049138d;
        }
        bVar2 = (pSVar3->m_builtInIndex)._value;
        newOpcode = Ld_A;
        if (bVar2 != 'H') {
          (pSVar14->m_builtInIndex)._value = bVar2;
        }
        goto LAB_0049138d;
      }
      goto LAB_0049132b;
    }
    newOpcode = UnwrapWithObj;
  }
  pRVar8 = BuildDstOpnd(this,R0,TyVar,false,true);
LAB_0049138d:
  pIVar9 = IR::Instr::New(newOpcode,&pRVar8->super_Opnd,&pRVar7->super_Opnd,this->m_func);
  AddInstr(this,pIVar9,local_34);
  return;
}

Assistant:

void
IRBuilder::BuildReg2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, uint32 nextOffset)
{
    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(R1);
    StackSym *      symSrc1 = src1Opnd->m_sym;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::Ld_A_ReuseLoc:
        newOpcode = Js::OpCode::Ld_A;
        reuseLoc = true;
        break;

    case Js::OpCode::Typeof_ReuseLoc:
        newOpcode = Js::OpCode::Typeof;
        reuseLoc = true;
        break;

    case Js::OpCode::UnwrapWithObj_ReuseLoc:
        newOpcode = Js::OpCode::UnwrapWithObj;
        reuseLoc = true;
        break;

    case Js::OpCode::SpreadObjectLiteral:
        // fall through
    case Js::OpCode::SetComputedNameVar:
    {
        IR::Instr *instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(this->BuildSrcOpnd(R0));
        instr->SetSrc2(src1Opnd);
        this->AddInstr(instr, offset);
        return;
    }
    case Js::OpCode::LdFuncExprFrameDisplay:
    {
        IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        IR::Instr *instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, m_func);
        Js::RegSlot envReg = this->GetEnvReg();
        if (envReg != Js::Constants::NoRegister)
        {
            instr->SetSrc2(BuildSrcOpnd(envReg));
        }
        this->AddInstr(instr, offset);

        IR::RegOpnd *src2Opnd = dstOpnd;
        src1Opnd = BuildSrcOpnd(R0);
        dstOpnd = BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
        instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, src2Opnd, m_func);
        dstOpnd->m_sym->m_isNotNumber = true;
        this->AddInstr(instr, offset);
        return;
    }
    }

    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0, TyVar, false, reuseLoc);
    StackSym *      dstSym = dstOpnd->m_sym;

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCode::Ld_A:
        if (symSrc1->m_builtInIndex != Js::BuiltinFunction::None)
        {
            // Note: don't set dstSym->m_builtInIndex to None here (see Win8 399972)
            dstSym->m_builtInIndex = symSrc1->m_builtInIndex;
        }
        break;

    case Js::OpCode::Delete_A:
        dstOpnd->SetValueType(ValueType::Boolean);
        break;
    case Js::OpCode::BeginSwitch:
        m_switchBuilder.BeginSwitch();
        newOpcode = Js::OpCode::Ld_A;
        break;
    case Js::OpCode::LdArrHead:
        src1Opnd->SetValueType(
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
        src1Opnd->SetValueTypeFixed();
        break;

    case Js::OpCode::LdInnerFrameDisplayNoParent:
    {
        instr = IR::Instr::New(Js::OpCode::LdInnerFrameDisplay, dstOpnd, src1Opnd, m_func);
        this->AddEnvOpndForInnerFrameDisplay(instr, offset);
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);

        return;
    }

    case Js::OpCode::Conv_Str:
        dstOpnd->SetValueType(ValueType::String);
        break;

    case Js::OpCode::Yield:
        // Jitting Loop Bodies containing Yield is not possible, blocked at callsites of GenerateLoopBody
        AssertMsg(!this->IsLoopBody(), "Attempting to JIT loop body containing Yield");

        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
        this->AddInstr(instr, offset);
        IR::Instr* yieldInstr = instr->ConvertToBailOutInstr(instr, IR::BailOutForGeneratorYield);
        this->m_lastInstr = yieldInstr;

        // This label indicates the bail-in section that we will jump to from the generator jump table
        auto* bailInLabel = IR::GeneratorBailInInstr::New(yieldInstr, m_func);
        bailInLabel->m_hasNonBranchRef = true;              // set to true so that we don't move this label around
        LABELNAMESET(bailInLabel, "GeneratorBailInLabel");
        this->AddInstr(bailInLabel, offset);
        this->m_func->AddYieldOffsetResumeLabel(nextOffset, bailInLabel);

        yieldInstr->GetBailOutInfo()->bailInInstr = bailInLabel;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, this->m_func))
        {
            IR::LabelInstr* traceBailInLabel = IR::LabelInstr::New(Js::OpCode::GeneratorOutputBailInTraceLabel, m_func);
            traceBailInLabel->m_hasNonBranchRef = true;     // set to true so that we don't move this label around
            LABELNAMESET(traceBailInLabel, "OutputBailInTrace");
            this->AddInstr(traceBailInLabel, offset);

            IR::Instr* traceBailIn = IR::Instr::New(Js::OpCode::GeneratorOutputBailInTrace, m_func);
            this->AddInstr(traceBailIn, offset);
        }
#endif

        IR::Instr* resumeYield = IR::Instr::New(Js::OpCode::GeneratorResumeYield, dstOpnd, m_func);
        this->AddInstr(resumeYield, offset);

        if (this->m_func->IsJitInDebugMode())
        {
            this->InsertBailOutForDebugger(offset, IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction | IR::BailOutStep);
        }

        return;
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
    }

    this->AddInstr(instr, offset);
}